

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.hpp
# Opt level: O0

IStreamer * __thiscall LiteScript::IStreamer::operator>>(IStreamer *this,float *v)

{
  float fVar1;
  float *v_local;
  IStreamer *this_local;
  
  fVar1 = Read<float>(this->stream);
  *v = fVar1;
  return this;
}

Assistant:

IStreamer& operator>>(T& v) {
            v = Read<T>(this->stream);
            return *this;
        }